

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetDomainNameByXpan
          (Registry *this,uint64_t aXpan,string *aName)

{
  Status SVar1;
  char cVar2;
  int iVar3;
  Domain dom;
  Network nwk;
  
  Network::Network(&nwk);
  Domain::Domain(&dom);
  SVar1 = GetNetworkByXpan(this,aXpan,&nwk);
  if (SVar1 == kSuccess) {
    iVar3 = (*this->mStorage->_vptr_PersistentStorage[0xd])(this->mStorage,&nwk.mDomainId,&dom);
    cVar2 = (char)iVar3;
    SVar1 = kNotFound;
    if (cVar2 != '\x01') {
      SVar1 = (cVar2 != '\0') << 2;
    }
    if (cVar2 == '\0') {
      std::__cxx11::string::_M_assign((string *)aName);
      SVar1 = kSuccess;
    }
  }
  std::__cxx11::string::~string((string *)&dom.mName);
  Network::~Network(&nwk);
  return SVar1;
}

Assistant:

Registry::Status Registry::GetDomainNameByXpan(uint64_t aXpan, std::string &aName)
{
    Registry::Status status;
    Network          nwk;
    Domain           dom;

    VerifyOrExit(Registry::Status::kSuccess == (status = GetNetworkByXpan(aXpan, nwk)));
    VerifyOrExit(Registry::Status::kSuccess == (status = MapStatus(mStorage->Get(nwk.mDomainId, dom))));
    aName = dom.mName;
exit:
    return status;
}